

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.hpp
# Opt level: O3

void __thiscall
cinatra::session::session
          (session *this,string *session_id,size_t session_timeout,bool need_set_to_client)

{
  pointer pcVar1;
  size_t sVar2;
  time_t tVar3;
  
  (this->session_id_)._M_dataplus._M_p = (pointer)&(this->session_id_).field_2;
  pcVar1 = (session_id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + session_id->_M_string_length);
  this->session_timeout_ = session_timeout;
  (this->mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->data_)._M_h._M_buckets = &(this->data_)._M_h._M_single_bucket;
  (this->data_)._M_h._M_bucket_count = 1;
  (this->data_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->data_)._M_h._M_element_count = 0;
  (this->data_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->data_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->data_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cookie::cookie(&this->cookie_,(string *)CSESSIONID_abi_cxx11_,&this->session_id_);
  this->need_set_to_client_ = need_set_to_client;
  sVar2 = this->session_timeout_;
  tVar3 = time((time_t *)0x0);
  this->time_stamp_ = tVar3 + sVar2;
  (this->cookie_).max_age_ = this->session_timeout_;
  return;
}

Assistant:

session(const std::string &session_id, std::size_t session_timeout,
          bool need_set_to_client)
      : session_id_(session_id),
        session_timeout_(session_timeout),
        cookie_(CSESSIONID, session_id_),
        need_set_to_client_(need_set_to_client) {
    time_stamp_ = session_timeout_ + std::time(nullptr);
    cookie_.set_max_age(session_timeout_);
  }